

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

vec2 __thiscall djb::microfacet::s2_to_u2(microfacet *this,vec3 *wo,vec3 *wi,void *user_args)

{
  long lVar1;
  args *paVar2;
  vec2 vVar3;
  args args;
  vec3 local_70;
  args local_64;
  
  if (wi->z < 0.0) {
    __assert_fail("wi.z >= 0 && \"invalid incident direction\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/demo-merl/dj_brdf.h"
                  ,0x5cf,
                  "virtual vec2 djb::microfacet::s2_to_u2(const vec3 &, const vec3 &, const void *) const"
                 );
  }
  if (user_args == (void *)0x0) {
    local_70 = (vec3)(ZEXT412(0x3f800000) << 0x40);
    microfacet::args::normalmap(&local_64,&local_70,1.0,1.0,0.0);
  }
  else {
    paVar2 = &local_64;
    for (lVar1 = 0x13; lVar1 != 0; lVar1 = lVar1 + -1) {
      (paVar2->mtra).r[0].x = *user_args;
      user_args = (float_t *)((long)user_args + 4);
      paVar2 = (args *)&(paVar2->mtra).r[0].y;
    }
  }
  local_70.y = wi->y + wo->y;
  local_70.x = wi->x + wo->x;
  local_70.z = wi->z + wo->z;
  local_70 = normalize(&local_70);
  vVar3 = h2_to_u2(this,&local_70,wi,&local_64);
  return vVar3;
}

Assistant:

vec2
microfacet::s2_to_u2(
	const vec3 &wo, const vec3 &wi, const void *user_args
) const {
	DJB_ASSERT(wi.z >= 0 && "invalid incident direction");
	microfacet::args args =
		user_args ? *reinterpret_cast<const microfacet::args *>(user_args)
		          : microfacet::args::standard();

	return h2_to_u2(s2_to_h2(wo, wi), wi, args);
}